

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * units::definedUnitsFromFile(string *__return_storage_ptr__,string *filename)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char cVar4;
  istream *piVar5;
  void *pvVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  size_type sVar14;
  ulong uVar15;
  _Alloc_hider _Var16;
  size_type sVar17;
  char *__data;
  string userdef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> meas_string;
  string line;
  precise_measurement meas;
  ifstream infile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  double local_2b8;
  precise_unit local_2b0;
  size_type local_2a0;
  undefined8 uStack_298;
  precise_measurement local_290;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [65];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_2e0 = __return_storage_ptr__;
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    local_2d8._M_string_length = 0;
    local_2d8.field_2._M_allocated_capacity =
         local_2d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
LAB_003f0d2e:
    do {
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_2d8,cVar4);
      sVar7 = local_2d8._M_string_length;
      _Var16._M_p = local_2d8._M_dataplus._M_p;
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_003f1470;
      sVar17 = 0xffffffffffffffff;
      if (local_2d8._M_string_length != 0) {
        sVar14 = 0;
        do {
          pvVar6 = memchr(" \t\n",(int)_Var16._M_p[sVar14],3);
          sVar17 = sVar14;
          if (pvVar6 == (void *)0x0) break;
          sVar14 = sVar14 + 1;
          sVar17 = 0xffffffffffffffff;
        } while (sVar7 != sVar14);
      }
      if (sVar17 != 0xffffffffffffffff) {
        cVar4 = local_2d8._M_dataplus._M_p[sVar17];
        if (cVar4 == '\'') {
LAB_003f0de5:
          lVar11 = 1;
          bVar13 = true;
          do {
            _Var16._M_p = local_2d8._M_dataplus._M_p;
            uVar15 = lVar11 + sVar17;
            uVar12 = 0xffffffffffffffff;
            if (uVar15 <= local_2d8._M_string_length && local_2d8._M_string_length - uVar15 != 0) {
              pvVar6 = memchr(local_2d8._M_dataplus._M_p + uVar15,
                              (int)local_2d8._M_dataplus._M_p[sVar17],
                              local_2d8._M_string_length - uVar15);
              uVar12 = -(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - (long)_Var16._M_p;
            }
            if (uVar12 == 0xffffffffffffffff) {
              lVar11 = 1;
              break;
            }
            if (_Var16._M_p[uVar12 - 1] == '\\') {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              erase(&local_2d8,uVar12 - 1,1);
            }
            else {
              bVar13 = false;
            }
            lVar11 = uVar12 - sVar17;
          } while (bVar13);
        }
        else {
          if (cVar4 == '#') goto LAB_003f0d2e;
          lVar11 = 1;
          if (cVar4 == '\"') goto LAB_003f0de5;
        }
        sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find_first_of(&local_2d8,",;=",lVar11 + sVar17,3);
        if (sVar7 == 0xffffffffffffffff) {
          local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_320,local_2d8._M_dataplus._M_p,
                     local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append(&local_320," is not a valid user defined unit definition\n");
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                    local_320._M_dataplus._M_p,local_320._M_string_length);
        }
        else {
          if (sVar7 == local_2d8._M_string_length - 1) {
            local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_320,local_2d8._M_dataplus._M_p,
                       local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append(&local_320," does not have any valid definitions\n");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0
                      ,local_320._M_dataplus._M_p,local_320._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320._M_dataplus._M_p != &local_320.field_2) {
              operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1
                             );
            }
          }
          uVar12 = 1;
          if (1 < (byte)(local_2d8._M_dataplus._M_p[sVar7 + 1] - 0x3dU)) {
            uVar12 = (ulong)(local_2d8._M_dataplus._M_p[sVar7 - 1] == '<');
            if (local_2d8._M_dataplus._M_p[sVar7 - 1] == '<') {
              sVar7 = sVar7 - 1;
            }
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_320,&local_2d8,sVar17,sVar7 - sVar17);
          cVar4 = local_320._M_dataplus._M_p[local_320._M_string_length - 1];
          while (cVar4 == ' ') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back(&local_320);
            cVar4 = local_320._M_dataplus._M_p[local_320._M_string_length - 1];
          }
          cVar1 = *local_320._M_dataplus._M_p;
          if (((cVar1 == '\'') || (cVar1 == '\"')) && (cVar4 == cVar1)) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back(&local_320);
            if (local_320._M_string_length != 1) {
              if (local_320._M_string_length == 2) {
                *local_320._M_dataplus._M_p = local_320._M_dataplus._M_p[1];
              }
              else {
                memmove(local_320._M_dataplus._M_p,local_320._M_dataplus._M_p + 1,
                        local_320._M_string_length - 1);
              }
            }
            local_320._M_dataplus._M_p[local_320._M_string_length - 1] = '\0';
            local_320._M_string_length = local_320._M_string_length - 1;
          }
          if (local_320._M_string_length == 0) {
            local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_300,local_2d8._M_dataplus._M_p,
                       local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append(&local_300," does not specify a user string\n");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0
                      ,local_300._M_dataplus._M_p,local_300._M_string_length);
          }
          else {
            sVar17 = sVar7 + uVar12 + 1;
            if (sVar17 < local_2d8._M_string_length) {
              do {
                if ((local_2d8._M_dataplus._M_p[sVar17] != ' ') &&
                   (local_2d8._M_dataplus._M_p[sVar17] != '\t')) goto LAB_003f1071;
                sVar17 = sVar17 + 1;
              } while (local_2d8._M_string_length != sVar17);
            }
            sVar17 = 0xffffffffffffffff;
LAB_003f1071:
            if (sVar17 == 0xffffffffffffffff) {
              local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_300,local_2d8._M_dataplus._M_p,
                         local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_300," does not specify a unit definition string\n");
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_2e0,local_300._M_dataplus._M_p,local_300._M_string_length);
            }
            else {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_300,&local_2d8,sVar17,0xffffffffffffffff);
              cVar4 = local_300._M_dataplus._M_p[local_300._M_string_length - 1];
              while (cVar4 == ' ') {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::pop_back(&local_300);
                cVar4 = local_300._M_dataplus._M_p[local_300._M_string_length - 1];
              }
              cVar1 = *local_300._M_dataplus._M_p;
              if (((cVar1 == '\'') || (cVar1 == '\"')) && (cVar4 == cVar1)) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::pop_back(&local_300);
                if (local_300._M_string_length != 1) {
                  if (local_300._M_string_length == 2) {
                    *local_300._M_dataplus._M_p = local_300._M_dataplus._M_p[1];
                  }
                  else {
                    memmove(local_300._M_dataplus._M_p,local_300._M_dataplus._M_p + 1,
                            local_300._M_string_length - 1);
                  }
                }
                local_300._M_dataplus._M_p[local_300._M_string_length - 1] = '\0';
                local_300._M_string_length = local_300._M_string_length - 1;
              }
              local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_278,local_300._M_dataplus._M_p,
                         local_300._M_dataplus._M_p + local_300._M_string_length);
              measurement_from_string(&local_290,&local_278,defaultMatchFlags);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._M_dataplus._M_p != &local_278.field_2) {
                operator_delete(local_278._M_dataplus._M_p,
                                local_278.field_2._M_allocated_capacity + 1);
              }
              uVar2 = local_290.units_._8_8_;
              local_2b8 = local_290.units_.multiplier_;
              if ((((local_290.units_.base_units_ == -0x56b5b78 && NAN(local_290.units_.multiplier_)
                    ) || (NAN(local_290.units_.multiplier_))) ||
                  (local_290.units_.base_units_ == -0x56b5b78)) || (NAN(local_290.value_))) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::substr(&local_258,&local_2d8,sVar17,0xffffffffffffffff);
                pbVar9 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_258," does not generate a valid unit\n");
                local_2b0.multiplier_ = (double)(pbVar9->_M_dataplus)._M_p;
                paVar10 = &pbVar9->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0.multiplier_ == paVar10) {
                  local_2a0 = paVar10->_M_allocated_capacity;
                  uStack_298 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
                  local_2b0.multiplier_ = (double)&local_2a0;
                }
                else {
                  local_2a0 = paVar10->_M_allocated_capacity;
                }
                local_2b0._8_8_ = pbVar9->_M_string_length;
                (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
                pbVar9->_M_string_length = 0;
                (pbVar9->field_2)._M_local_buf[0] = '\0';
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2e0,(char *)local_2b0.multiplier_,local_2b0._8_8_);
                if ((size_type *)local_2b0.multiplier_ != &local_2a0) {
                  operator_delete((void *)local_2b0.multiplier_,local_2a0 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_dataplus._M_p != &local_258.field_2) {
                  operator_delete(local_258._M_dataplus._M_p,
                                  local_258.field_2._M_allocated_capacity + 1);
                }
              }
              else if (local_2d8._M_dataplus._M_p[uVar12 + sVar7] == '>') {
                local_2b8 = local_290.units_.multiplier_ * local_290.value_;
                if ((_ZN5unitsL21allowUserDefinedUnitsE_0 & 1) != 0) {
                  pmVar8 = std::__detail::
                           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)user_defined_units_abi_cxx11_,(key_type *)&local_320);
                  uVar3 = local_290.units_._8_8_;
                  pmVar8->multiplier_ = local_2b8;
                  local_290.units_.base_units_ = SUB84(uVar2,0);
                  local_290.units_.commodity_ = SUB84(uVar2,4);
                  pmVar8->base_units_ = local_290.units_.base_units_;
                  pmVar8->commodity_ = local_290.units_.commodity_;
                  _ZN5unitsL21allowUserDefinedUnitsE_0 = _ZN5unitsL21allowUserDefinedUnitsE_0 & 1;
                  local_290.units_._8_8_ = uVar3;
                }
              }
              else if (local_2d8._M_dataplus._M_p[sVar7] == '<') {
                local_2b0.multiplier_ = local_290.units_.multiplier_ * local_290.value_;
                local_2b0.base_units_ = local_290.units_.base_units_;
                local_2b0.commodity_ = local_290.units_.commodity_;
                addUserDefinedOutputUnit((string *)&local_320,&local_2b0);
              }
              else {
                local_2b0.multiplier_ = local_290.units_.multiplier_ * local_290.value_;
                local_2b0.base_units_ = local_290.units_.base_units_;
                local_2b0.commodity_ = local_290.units_.commodity_;
                addUserDefinedUnit((string *)&local_320,&local_2b0);
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
            operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
      }
    } while( true );
  }
  std::operator+(&local_320,"unable to read file ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filename);
  pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append(&local_320,"\n");
  local_2d8._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
  paVar10 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p == paVar10) {
    local_2d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  }
  else {
    local_2d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2d8._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
             &local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  _Var16._M_p = local_320._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p == &local_320.field_2) goto LAB_003f148c;
LAB_003f1484:
  operator_delete(_Var16._M_p,local_320.field_2._M_allocated_capacity + 1);
LAB_003f148c:
  std::ifstream::~ifstream(local_238);
  return local_2e0;
LAB_003f1470:
  local_320.field_2._M_allocated_capacity = local_2d8.field_2._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p == &local_2d8.field_2) goto LAB_003f148c;
  goto LAB_003f1484;
}

Assistant:

std::string definedUnitsFromFile(const std::string& filename) noexcept
{
    std::string output;
    try {
        std::ifstream infile(filename);
        if (!infile.is_open()) {
            output = "unable to read file " + filename + "\n";
            return output;
        }
        std::string line;
        while (std::getline(infile, line)) {
            auto commentloc = line.find_first_not_of(" \t\n");
            if (commentloc == std::string::npos || line[commentloc] == '#') {
                continue;
            }
            std::size_t esep{1};  // extra separation location to handle quotes
            if (line[commentloc] == '\"' || line[commentloc] == '\'') {
                bool notfound{true};
                while (notfound) {
                    esep =
                        line.find_first_of(line[commentloc], commentloc + esep);
                    if (esep == std::string::npos) {
                        esep = 1;
                        break;
                    }
                    if (line[esep - 1] != '\\') {
                        notfound = false;
                    } else {
                        // remove the escaped quote
                        line.erase(esep - 1, 1);
                    }
                    esep -= commentloc;
                }
            }
            auto sep = line.find_first_of(",;=", commentloc + esep);
            if (sep == std::string::npos) {
                output +=
                    line + " is not a valid user defined unit definition\n";
                continue;
            }
            if (sep == line.size() - 1) {
                output += line + " does not have any valid definitions\n";
            }
            int length{0};
            if (line[sep + 1] == '=' || line[sep + 1] == '>') {
                length = 1;
            }
            if (length == 0 && line[sep - 1] == '<') {
                length = 1;
                --sep;
            }
            // get the new definition name
            std::string userdef = line.substr(commentloc, sep - commentloc);
            while (userdef.back() == ' ') {
                userdef.pop_back();
            }
            // remove quotes
            if ((userdef.front() == '\"' || userdef.front() == '\'') &&
                userdef.back() == userdef.front()) {
                userdef.pop_back();
                userdef.erase(userdef.begin());
            }
            if (userdef.empty()) {
                output += line + " does not specify a user string\n";
                continue;
            }
            // the unit string
            auto sloc = line.find_first_not_of(" \t", sep + length + 1);
            if (sloc == std::string::npos) {
                output += line + " does not specify a unit definition string\n";
                continue;
            }
            auto meas_string = line.substr(sloc);
            while (meas_string.back() == ' ') {
                meas_string.pop_back();
            }
            if ((meas_string.front() == '\"' || meas_string.front() == '\'') &&
                meas_string.back() == meas_string.front()) {
                meas_string.pop_back();
                meas_string.erase(meas_string.begin());
            }
            auto meas = measurement_from_string(meas_string);
            if (!is_valid(meas)) {
                output +=
                    line.substr(sloc) + " does not generate a valid unit\n";
                continue;
            }

            if (line[sep + length] == '>') {
                addUserDefinedInputUnit(userdef, meas.as_unit());
            } else if (line[sep] == '<') {
                addUserDefinedOutputUnit(userdef, meas.as_unit());
            } else {
                addUserDefinedUnit(userdef, meas.as_unit());
            }
        }
    }
    // LCOV_EXCL_START
    catch (const std::exception& e) {
        output += e.what();
        output.push_back('\n');
        // this is mainly just to catch any weird errors coming from somewhere
        // so this function can be noexcept
    }
    // LCOV_EXCL_STOP
    return output;
}